

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O0

int saslmechanism_get_init_bytes
              (SASL_MECHANISM_HANDLE sasl_mechanism,SASL_MECHANISM_BYTES *init_bytes)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  SASL_MECHANISM_BYTES *init_bytes_local;
  SASL_MECHANISM_HANDLE sasl_mechanism_local;
  
  if (sasl_mechanism == (SASL_MECHANISM_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_mechanism.c"
                ,"saslmechanism_get_init_bytes",0x5b,1,"NULL sasl_mechanism");
    }
    l._4_4_ = 0x5c;
  }
  else {
    iVar1 = (*sasl_mechanism->sasl_mechanism_interface_description->
              concrete_sasl_mechanism_get_init_bytes)
                      (sasl_mechanism->concrete_sasl_mechanism_handle,init_bytes);
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_mechanism.c"
                  ,"saslmechanism_get_init_bytes",100,1,
                  "concrete_sasl_mechanism_get_init_bytes failed");
      }
      l._4_4_ = 0x65;
    }
  }
  return l._4_4_;
}

Assistant:

int saslmechanism_get_init_bytes(SASL_MECHANISM_HANDLE sasl_mechanism, SASL_MECHANISM_BYTES* init_bytes)
{
    int result;

    /* Codes_SRS_SASL_MECHANISM_01_012: [If the argument `sasl_mechanism` is NULL, `saslmechanism_get_init_bytes` shall fail and return a non-zero value.] */
    if (sasl_mechanism == NULL)
    {
        LogError("NULL sasl_mechanism");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_SASL_MECHANISM_01_010: [`saslmechanism_get_init_bytes` shall call the specific `concrete_sasl_mechanism_get_init_bytes` function specified in `saslmechanism_create`, passing the `init_bytes` argument to it.] */
        if (sasl_mechanism->sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes(sasl_mechanism->concrete_sasl_mechanism_handle, init_bytes) != 0)
        {
            /* Codes_SRS_SASL_MECHANISM_01_013: [If the underlying `concrete_sasl_mechanism_get_init_bytes` fails, `saslmechanism_get_init_bytes` shall fail and return a non-zero value.] */
            LogError("concrete_sasl_mechanism_get_init_bytes failed");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_SASL_MECHANISM_01_011: [On success, `saslmechanism_get_init_bytes` shall return 0.] */
            result = 0;
        }
    }

    return result;
}